

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderGLImpl,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
               (ComputePipelineStateCreateInfo *CreateInfo,
               vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  bool bVar1;
  int iVar2;
  Char *pCVar3;
  undefined4 extraout_var;
  undefined1 local_100 [8];
  string msg_5;
  string msg_4;
  RefCntAutoPtr<Diligent::ShaderGLImpl> pShaderImpl;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  SHADER_TYPE *ActiveShaderStages_local;
  bool WaitUntilShadersReady_local;
  vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *ShaderStages_local;
  ComputePipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = ActiveShaderStages;
  bVar1 = PipelineStateDesc::IsComputePipeline((PipelineStateDesc *)CreateInfo);
  if (!bVar1) {
    FormatString<char[26],char[39]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",
               (char (*) [39])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0x101;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)local_48);
  }
  std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::clear
            (ShaderStages);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[57]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
               (char (*) [57])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0x105;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x105);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (CreateInfo->pCS == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0x106;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  iVar2 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              ((string *)&pShaderImpl,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",
               (char (*) [60])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0x107;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)&pShaderImpl);
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)((long)&msg_4.field_2 + 8),
             (IObject *)CreateInfo->pCS,(INTERFACE_ID *)ShaderGLImpl::IID_InternalImpl);
  bVar1 = RefCntAutoPtr<Diligent::ShaderGLImpl>::operator!
                    ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)((long)&msg_4.field_2 + 8));
  if (bVar1) {
    FormatString<char[40]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [40])"Unexpected shader object implementation");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0x10a;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10a);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  WaitUntilShaderReadyIfRequested<Diligent::ShaderGLImpl>
            ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)((long)&msg_4.field_2 + 8),
             WaitUntilShadersReady);
  std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>::
  emplace_back<Diligent::RefCntAutoPtr<Diligent::ShaderGLImpl>&>
            ((vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>> *)ShaderStages
             ,(RefCntAutoPtr<Diligent::ShaderGLImpl> *)((long)&msg_4.field_2 + 8));
  *(undefined4 *)msg.field_2._8_8_ = 0x20;
  bVar1 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::empty
                    (ShaderStages);
  if (bVar1) {
    FormatString<char[26],char[22]>
              ((string *)local_100,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)local_100);
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)((long)&msg_4.field_2 + 8));
  return;
}

Assistant:

void ExtractShaders(const ComputePipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                        ShaderStages,
                    bool                                  WaitUntilShadersReady,
                    SHADER_TYPE&                          ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsComputePipeline());

    ShaderStages.clear();

    VERIFY_EXPR(CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE);
    VERIFY_EXPR(CreateInfo.pCS != nullptr);
    VERIFY_EXPR(CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE);

    RefCntAutoPtr<ShaderImplType> pShaderImpl{CreateInfo.pCS, ShaderImplType::IID_InternalImpl};
    VERIFY(pShaderImpl, "Unexpected shader object implementation");
    WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
    ShaderStages.emplace_back(pShaderImpl);
    ActiveShaderStages = SHADER_TYPE_COMPUTE;

    VERIFY_EXPR(!ShaderStages.empty());
}